

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O3

Stream * rw::readMaterialMatFX(Stream *stream,int32 param_2,void *object,int32 offset,int32 param_5)

{
  int *piVar1;
  bool bVar2;
  uint32 uVar3;
  int32 iVar4;
  int32 iVar5;
  int32 iVar6;
  Texture *pTVar7;
  Texture *pTVar8;
  long lVar9;
  bool bVar10;
  float32 fVar11;
  
  uVar3 = Stream::readU32(stream);
  MatFX::setEffects((Material *)object,uVar3);
  piVar1 = *(int **)((long)object + (long)DAT_0014b1fc);
  bVar2 = true;
  do {
    bVar10 = bVar2;
    uVar3 = Stream::readU32(stream);
    if (uVar3 == 4) {
      iVar4 = Stream::readI32(stream);
      iVar5 = Stream::readI32(stream);
      iVar6 = Stream::readI32(stream);
      if (iVar6 == 0) {
        pTVar7 = (Texture *)0x0;
      }
      else {
        bVar2 = findChunk(stream,6,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar2) {
          readMaterialMatFX();
          return (Stream *)0x0;
        }
        pTVar7 = Texture::streamRead(stream);
      }
      lVar9 = 0;
      if (*piVar1 != 4) {
        lVar9 = (ulong)(piVar1[10] == 4) * 2 + -1;
      }
      *(Texture **)(piVar1 + lVar9 * 10 + 2) = pTVar7;
      piVar1[lVar9 * 10 + 4] = iVar4;
      piVar1[lVar9 * 10 + 5] = iVar5;
    }
    else if (uVar3 == 2) {
      fVar11 = Stream::readF32(stream);
      iVar4 = Stream::readI32(stream);
      iVar5 = Stream::readI32(stream);
      if (iVar5 == 0) {
        pTVar7 = (Texture *)0x0;
      }
      else {
        bVar2 = findChunk(stream,6,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar2) {
          readMaterialMatFX();
          return (Stream *)0x0;
        }
        pTVar7 = Texture::streamRead(stream);
      }
      lVar9 = 0;
      if (*piVar1 != 2) {
        lVar9 = (ulong)(piVar1[10] == 2) * 2 + -1;
      }
      *(Texture **)(piVar1 + lVar9 * 10 + 4) = pTVar7;
      piVar1[lVar9 * 10 + 7] = iVar4;
      piVar1[lVar9 * 10 + 6] = (int)fVar11;
    }
    else if (uVar3 == 1) {
      fVar11 = Stream::readF32(stream);
      iVar4 = Stream::readI32(stream);
      if (iVar4 == 0) {
        pTVar7 = (Texture *)0x0;
      }
      else {
        bVar2 = findChunk(stream,6,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar2) {
          readMaterialMatFX();
          return (Stream *)0x0;
        }
        pTVar7 = Texture::streamRead(stream);
      }
      iVar4 = Stream::readI32(stream);
      if (iVar4 == 0) {
        pTVar8 = (Texture *)0x0;
      }
      else {
        bVar2 = findChunk(stream,6,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar2) {
          readMaterialMatFX();
          return (Stream *)0x0;
        }
        pTVar8 = Texture::streamRead(stream);
      }
      lVar9 = 0;
      if (*piVar1 != 1) {
        lVar9 = (ulong)(piVar1[10] == 1) * 2 + -1;
      }
      *(Texture **)(piVar1 + lVar9 * 10 + 4) = pTVar7;
      *(Texture **)(piVar1 + lVar9 * 10 + 6) = pTVar8;
      piVar1[lVar9 * 10 + 8] = (int)fVar11;
    }
    bVar2 = false;
  } while (bVar10);
  return stream;
}

Assistant:

static Stream*
readMaterialMatFX(Stream *stream, int32, void *object, int32 offset, int32)
{
	Material *mat;
	MatFX *matfx;
	Texture *tex, *bumpedTex;
	float coefficient;
	int32 fbAlpha;
	int32 srcBlend, dstBlend;
	int32 idx;

	mat = (Material*)object;
	MatFX::setEffects(mat, stream->readU32());
	matfx = MatFX::get(mat);

	for(int i = 0; i < 2; i++){
		uint32 type = stream->readU32();
		switch(type){
		case MatFX::BUMPMAP:
			coefficient = stream->readF32();
			bumpedTex = tex = nil;
			if(stream->readI32()){
				if(!findChunk(stream, ID_TEXTURE,
				              nil, nil)){
					RWERROR((ERR_CHUNK, "TEXTURE"));
					return nil;
				}
				bumpedTex = Texture::streamRead(stream);
			}
			if(stream->readI32()){
				if(!findChunk(stream, ID_TEXTURE,
				              nil, nil)){
					RWERROR((ERR_CHUNK, "TEXTURE"));
					return nil;
				}
				tex = Texture::streamRead(stream);
			}
			idx = matfx->getEffectIndex(type);
			assert(idx >= 0);
			matfx->fx[idx].bump.bumpedTex = bumpedTex;
			matfx->fx[idx].bump.tex = tex;
			matfx->fx[idx].bump.coefficient = coefficient;
			break;

		case MatFX::ENVMAP:
			coefficient = stream->readF32();
			fbAlpha = stream->readI32();
			tex = nil;
			if(stream->readI32()){
				if(!findChunk(stream, ID_TEXTURE,
				              nil, nil)){
					RWERROR((ERR_CHUNK, "TEXTURE"));
					return nil;
				}
				tex = Texture::streamRead(stream);
			}
			idx = matfx->getEffectIndex(type);
			assert(idx >= 0);
			matfx->fx[idx].env.tex = tex;
			matfx->fx[idx].env.fbAlpha = fbAlpha;
			matfx->fx[idx].env.coefficient = coefficient;
			break;

		case MatFX::DUAL:
			srcBlend = stream->readI32();
			dstBlend = stream->readI32();
			tex = nil;
			if(stream->readI32()){
				if(!findChunk(stream, ID_TEXTURE,
				              nil, nil)){
					RWERROR((ERR_CHUNK, "TEXTURE"));
					return nil;
				}
				tex = Texture::streamRead(stream);
			}
			idx = matfx->getEffectIndex(type);
			assert(idx >= 0);
			matfx->fx[idx].dual.tex = tex;
			matfx->fx[idx].dual.srcBlend = srcBlend;
			matfx->fx[idx].dual.dstBlend = dstBlend;
			break;
		}
	}
	return stream;
}